

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_sys_cfg_st.cpp
# Opt level: O0

MPP_RET mpp_sys_cfg_st_get_v_stride(MppSysCfgStVStrd *v_stride_cfg)

{
  char *pcVar1;
  MppSysCfg local_20;
  MppSysCfg cfg;
  MppSysCfgStVStrd *pMStack_10;
  MPP_RET ret;
  MppSysCfgStVStrd *v_stride_cfg_local;
  
  cfg._4_4_ = 0;
  pMStack_10 = v_stride_cfg;
  cfg._4_4_ = mpp_sys_cfg_get(&local_20);
  if (cfg._4_4_ == MPP_OK) {
    cfg._4_4_ = mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:enable",1);
    cfg._4_4_ = mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:type",pMStack_10->type);
    cfg._4_4_ = mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:fmt_fbc",pMStack_10->fmt_fbc);
    cfg._4_4_ = mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:height",pMStack_10->height);
    cfg._4_4_ = mpp_sys_cfg_set_u32(local_20,"dec_buf_chk:v_stride",pMStack_10->v_stride);
    mpp_sys_cfg_ioctl(local_20);
    cfg._4_4_ = mpp_sys_cfg_get_u32(local_20,"dec_buf_chk:v_stride",&pMStack_10->v_stride);
    cfg._4_4_ = mpp_sys_cfg_put(local_20);
    if (cfg._4_4_ != MPP_OK) {
      _mpp_log_l(2,"mpp_sys_cfg_st","mpp_sys_cfg_put failed\n",(char *)0x0);
    }
  }
  else {
    _mpp_log_l(2,"mpp_sys_cfg_st","mpp_sys_cfg_get failed\n",(char *)0x0);
  }
  pcVar1 = "success";
  if (cfg._4_4_ != MPP_OK) {
    pcVar1 = "failed";
  }
  _mpp_log_l(2,"mpp_sys_cfg_st","sys cfg get paras %s\n","mpp_sys_cfg_st_get_v_stride",pcVar1);
  return cfg._4_4_;
}

Assistant:

MPP_RET mpp_sys_cfg_st_get_v_stride(MppSysCfgStVStrd *v_stride_cfg)
{
    MPP_RET ret = MPP_OK;
    MppSysCfg cfg;

    ret = mpp_sys_cfg_get(&cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_get failed\n");
        goto DONE;
    }

    /* set correct parameter */
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:enable", 1);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:type", v_stride_cfg->type);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:fmt_fbc", v_stride_cfg->fmt_fbc);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:height", v_stride_cfg->height);
    ret = mpp_sys_cfg_set_u32(cfg, "dec_buf_chk:v_stride", v_stride_cfg->v_stride);

    /* get result */
    mpp_sys_cfg_ioctl(cfg);

    ret = mpp_sys_cfg_get_u32(cfg, "dec_buf_chk:v_stride", &v_stride_cfg->v_stride);

    ret = mpp_sys_cfg_put(cfg);
    if (ret) {
        mpp_err("mpp_sys_cfg_put failed\n");
        goto DONE;
    }

DONE:
    mpp_err_f("sys cfg get paras %s\n", ret ? "failed" : "success");
    return ret;
}